

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O2

double __thiscall
chrono::ChFunction_Mocap::LinInterp(ChFunction_Mocap *this,ChArray<> *array,double x,double x_max)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  double dVar4;
  uint uVar5;
  CoeffReturnType pdVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar3 = this->samples;
  dVar4 = (x / x_max) * (double)iVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4;
  auVar9 = vroundsd_avx(auVar9,auVar9,9);
  uVar7 = ~((int)auVar9._0_8_ >> 0x1f) & (int)auVar9._0_8_;
  if (iVar3 <= (int)uVar7) {
    uVar7 = iVar3 - 1U;
  }
  uVar8 = 0xffffffff;
  if (-1 < (int)uVar7) {
    uVar8 = uVar7;
  }
  auVar9 = vcvtdq2pd_avx(ZEXT416((uint)(int)dVar4));
  uVar5 = uVar8 + 1;
  if (iVar3 <= (int)(uVar8 + 1)) {
    uVar5 = iVar3 - 1U;
  }
  dVar4 = dVar4 - auVar9._0_8_;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)array,
                      (long)(int)uVar7);
  dVar1 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)array,
                      (long)(int)uVar5);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = 1.0 - dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4 * *pdVar6;
  auVar9 = vfmadd231sd_fma(auVar10,auVar11,auVar2);
  return auVar9._0_8_;
}

Assistant:

double ChFunction_Mocap::LinInterp(const ChArray<>& array, double x, double x_max) const {
    double position;
    double weightA, weightB;
    int ia, ib;

    position = ((double)samples * (x / x_max));

    ia = (int)floor(position);
    if (ia < 0) {
        ia = 0;
    };
    if (ia >= samples) {
        ia = samples - 1;
    }

    ib = ia + 1;
    if (ib < 0) {
        ib = 0;
    };
    if (ib >= samples) {
        ib = samples - 1;
    };

    weightB = position - (int)position;
    weightA = 1 - weightB;

    return (weightA * array(ia) + weightB * array(ib));
}